

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

void __thiscall hwnet::Epoll::Enable(Epoll *this,Ptr *channel,int flag)

{
  undefined4 uVar1;
  int __fd;
  int iVar2;
  element_type *peVar3;
  undefined1 local_28 [8];
  epoll_event ev;
  int flag_local;
  Ptr *channel_local;
  Epoll *this_local;
  
  ev.data.fd = flag;
  unique0x100000de = &channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>;
  memset(local_28,0,0xc);
  register0x00000000 =
       std::__shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>::get(stack0xffffffffffffffe8);
  peVar3 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)stack0xffffffffffffffe8);
  local_28._0_4_ = peVar3->events;
  if ((ev.data.u32 & 2) != 0) {
    local_28._0_4_ = local_28._0_4_ | 1;
  }
  if ((ev.data.u32 & 4) != 0) {
    local_28._0_4_ = local_28._0_4_ | 4;
  }
  iVar2 = this->epfd;
  peVar3 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)stack0xffffffffffffffe8);
  __fd = (*peVar3->_vptr_Channel[1])();
  iVar2 = epoll_ctl(iVar2,3,__fd,(epoll_event *)local_28);
  uVar1 = local_28._0_4_;
  if (iVar2 == 0) {
    peVar3 = std::__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stack0xffffffffffffffe8);
    peVar3->events = uVar1;
  }
  return;
}

Assistant:

void Epoll::Enable(const Channel::Ptr &channel,int flag) {

	epoll_event ev = {0};
	ev.data.ptr = channel.get();
	ev.events = channel->events;
		
	if(flag & Poller::Read) {
		ev.events |= EPOLLIN;
	}

	if(flag & Poller::Write) {
		ev.events |= EPOLLOUT;
	}

	if(0 == epoll_ctl(this->epfd,EPOLL_CTL_MOD,channel->Fd(),&ev)) {
		channel->events = ev.events;
	}

}